

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatypes-tests.cpp
# Opt level: O2

void check<int>(unique_ptr<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>_> *db,
               int v)

{
  HashedValue *this;
  IDatabase *pIVar1;
  SourceLineInfo local_230;
  AssertionHandler catchAssertionHandler;
  undefined8 local_1d8;
  size_t local_1d0;
  BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&> local_1c8;
  int v_local;
  string k;
  EncodedValue ev;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  StringRef local_f0;
  StringRef local_e0;
  StringRef local_d0;
  StringRef local_c0;
  StringRef local_b0;
  StringRef local_a0;
  StringRef local_90;
  StringRef local_80;
  EncodedValue evr;
  
  v_local = v;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&k,"testkey",(allocator<char> *)&catchAssertionHandler);
  groundupdb::EncodedValue::EncodedValue<int,void>(&ev,&v_local);
  pIVar1 = (db->_M_t).
           super___uniq_ptr_impl<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdb::IDatabase_*,_std::default_delete<groundupdb::IDatabase>_>
           .super__Head_base<0UL,_groundupdb::IDatabase_*,_false>._M_head_impl;
  std::__cxx11::string::string((string *)&local_110,(string *)&k);
  groundupdb::HashedValue::HashedValue<std::__cxx11::string>
            ((HashedValue *)&catchAssertionHandler,&local_110);
  (*pIVar1->_vptr_IDatabase[3])(pIVar1,&catchAssertionHandler,&ev);
  groundupdb::HashedValue::~HashedValue((HashedValue *)&catchAssertionHandler);
  std::__cxx11::string::~string((string *)&local_110);
  pIVar1 = (db->_M_t).
           super___uniq_ptr_impl<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdb::IDatabase_*,_std::default_delete<groundupdb::IDatabase>_>
           .super__Head_base<0UL,_groundupdb::IDatabase_*,_false>._M_head_impl;
  std::__cxx11::string::string((string *)&local_130,(string *)&k);
  groundupdb::HashedValue::HashedValue<std::__cxx11::string>
            ((HashedValue *)&catchAssertionHandler,&local_130);
  (*pIVar1->_vptr_IDatabase[5])(&evr,pIVar1,&catchAssertionHandler);
  groundupdb::HashedValue::~HashedValue((HashedValue *)&catchAssertionHandler);
  std::__cxx11::string::~string((string *)&local_130);
  local_1c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x17d06d;
  local_1c8.super_ITransientExpression.m_isBinaryExpression = true;
  local_1c8.super_ITransientExpression.m_result = false;
  local_1c8.super_ITransientExpression._10_6_ = 0;
  local_230.file =
       "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
  ;
  local_230.line = 0x3f;
  Catch::StringRef::StringRef(&local_80,"ev.hasValue()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_1c8,&local_230,local_80,Normal);
  local_1c8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_1c8.super_ITransientExpression._vptr_ITransientExpression._1_7_,ev.m_has_value
               );
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1c8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_1c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x17d06d;
  local_1c8.super_ITransientExpression.m_isBinaryExpression = true;
  local_1c8.super_ITransientExpression.m_result = false;
  local_1c8.super_ITransientExpression._10_6_ = 0;
  local_230.file =
       "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
  ;
  local_230.line = 0x40;
  Catch::StringRef::StringRef(&local_90,"evr.hasValue()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_1c8,&local_230,local_90,Normal);
  local_1c8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_1c8.super_ITransientExpression._vptr_ITransientExpression._1_7_,
                evr.m_has_value);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1c8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_1c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x17d06d;
  local_1c8.super_ITransientExpression.m_isBinaryExpression = true;
  local_1c8.super_ITransientExpression.m_result = false;
  local_1c8.super_ITransientExpression._10_6_ = 0;
  local_230.file =
       "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
  ;
  local_230.line = 0x41;
  Catch::StringRef::StringRef(&local_a0,"0 != ev.hash()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_1c8,&local_230,local_a0,Normal);
  local_1d8._0_4_ = 0;
  local_230.file = (char *)&local_1d8;
  local_1d0 = groundupdb::HashedValue::hash(&ev.m_value);
  Catch::ExprLhs<int_const&>::operator!=
            ((BinaryExpr<const_int_&,_const_unsigned_long_&> *)&local_1c8,
             (ExprLhs<int_const&> *)&local_230,&local_1d0);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_1c8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_1c8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_1c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x17d06d;
  local_1c8.super_ITransientExpression.m_isBinaryExpression = true;
  local_1c8.super_ITransientExpression.m_result = false;
  local_1c8.super_ITransientExpression._10_6_ = 0;
  local_230.file =
       "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
  ;
  local_230.line = 0x42;
  Catch::StringRef::StringRef(&local_b0,"0 != evr.hash()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_1c8,&local_230,local_b0,Normal);
  local_1d8 = (ulong)local_1d8._4_4_ << 0x20;
  this = &evr.m_value;
  local_230.file = (char *)&local_1d8;
  local_1d0 = groundupdb::HashedValue::hash(this);
  Catch::ExprLhs<int_const&>::operator!=
            ((BinaryExpr<const_int_&,_const_unsigned_long_&> *)&local_1c8,
             (ExprLhs<int_const&> *)&local_230,&local_1d0);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_1c8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_1c8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_1c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x17d06d;
  local_1c8.super_ITransientExpression.m_isBinaryExpression = true;
  local_1c8.super_ITransientExpression.m_result = false;
  local_1c8.super_ITransientExpression._10_6_ = 0;
  local_230.file =
       "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
  ;
  local_230.line = 0x43;
  Catch::StringRef::StringRef(&local_c0,"ev.hash() == evr.hash()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_1c8,&local_230,local_c0,Normal);
  local_1d0 = groundupdb::HashedValue::hash(&ev.m_value);
  local_230.file = (char *)&local_1d0;
  local_1d8 = groundupdb::HashedValue::hash(this);
  Catch::ExprLhs<unsigned_long_const&>::operator==
            (&local_1c8,(ExprLhs<unsigned_long_const&> *)&local_230,&local_1d8);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_1c8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_1c8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_1c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x17d06d;
  local_1c8.super_ITransientExpression.m_isBinaryExpression = true;
  local_1c8.super_ITransientExpression.m_result = false;
  local_1c8.super_ITransientExpression._10_6_ = 0;
  local_230.file =
       "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
  ;
  local_230.line = 0x44;
  Catch::StringRef::StringRef(&local_d0,"0 != ev.length()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_1c8,&local_230,local_d0,Normal);
  local_1d8 = local_1d8 & 0xffffffff00000000;
  local_230.file = (char *)&local_1d8;
  local_1d0 = groundupdb::HashedValue::length(&ev.m_value);
  Catch::ExprLhs<int_const&>::operator!=
            ((BinaryExpr<const_int_&,_const_unsigned_long_&> *)&local_1c8,
             (ExprLhs<int_const&> *)&local_230,&local_1d0);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_1c8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_1c8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_1c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x17d06d;
  local_1c8.super_ITransientExpression.m_isBinaryExpression = true;
  local_1c8.super_ITransientExpression.m_result = false;
  local_1c8.super_ITransientExpression._10_6_ = 0;
  local_230.file =
       "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
  ;
  local_230.line = 0x45;
  Catch::StringRef::StringRef(&local_e0,"0 != evr.length()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_1c8,&local_230,local_e0,Normal);
  local_1d8 = local_1d8 & 0xffffffff00000000;
  local_230.file = (char *)&local_1d8;
  local_1d0 = groundupdb::HashedValue::length(this);
  Catch::ExprLhs<int_const&>::operator!=
            ((BinaryExpr<const_int_&,_const_unsigned_long_&> *)&local_1c8,
             (ExprLhs<int_const&> *)&local_230,&local_1d0);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_1c8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_1c8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_1c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x17d06d;
  local_1c8.super_ITransientExpression.m_isBinaryExpression = true;
  local_1c8.super_ITransientExpression.m_result = false;
  local_1c8.super_ITransientExpression._10_6_ = 0;
  local_230.file =
       "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
  ;
  local_230.line = 0x46;
  Catch::StringRef::StringRef(&local_f0,"ev.length() == evr.length()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_1c8,&local_230,local_f0,Normal);
  local_1d0 = groundupdb::HashedValue::length(&ev.m_value);
  local_230.file = (char *)&local_1d0;
  local_1d8 = groundupdb::HashedValue::length(this);
  Catch::ExprLhs<unsigned_long_const&>::operator==
            (&local_1c8,(ExprLhs<unsigned_long_const&> *)&local_230,&local_1d8);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_1c8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_1c8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  groundupdb::HashedValue::~HashedValue(this);
  groundupdb::HashedValue::~HashedValue(&ev.m_value);
  std::__cxx11::string::~string((string *)&k);
  return;
}

Assistant:

void check(const std::unique_ptr<groundupdb::IDatabase> &db, T v) {
  std::string k("testkey");
  groundupdb::EncodedValue ev(v);
  db->setKeyValue(k, std::move(ev));
  groundupdb::EncodedValue evr = db->getKeyValue(k);
  REQUIRE(ev.hasValue());
  REQUIRE(evr.hasValue());
  REQUIRE(0 != ev.hash());
  REQUIRE(0 != evr.hash());
  REQUIRE(ev.hash() == evr.hash());
  REQUIRE(0 != ev.length());
  REQUIRE(0 != evr.length());
  REQUIRE(ev.length() == evr.length());
}